

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall NLReaderTest_ReadCon_Test::TestBody(NLReaderTest_ReadCon_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  AssertHelper local_b8 [2];
  undefined1 local_a8 [16];
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88;
  string local_68;
  string local_48;
  
  local_b8[0].data_ = (AssertHelperData *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_b8);
  paVar1 = &local_d8.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d8.field_2._M_allocated_capacity = *psVar4;
    local_d8.field_2._8_4_ = (undefined4)plVar3[3];
    local_d8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar4;
    local_d8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"C0\nn0\n","");
  ReadNL(&local_88,&local_48,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_98,"std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"c0: ;\"",
             "ReadNL(\"C0\\nn0\\n\")",&local_d8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0].data_ != (AssertHelperData *)local_a8) {
    operator_delete(local_b8[0].data_,local_a8._0_8_ + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x463,pcVar5);
    testing::internal::AssertHelper::operator=(local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8[0].data_ = (AssertHelperData *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_b8);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d8.field_2._M_allocated_capacity = *psVar4;
    local_d8.field_2._8_4_ = (undefined4)plVar3[3];
    local_d8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar4;
    local_d8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"C0\no13\nn0\n","");
  ReadNL(&local_88,&local_68,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_98,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"c0: u13(0);\"",
             "ReadNL(\"C0\\no13\\nn0\\n\")",&local_d8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0].data_ != (AssertHelperData *)local_a8) {
    operator_delete(local_b8[0].data_,local_a8._0_8_ + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x464,pcVar5);
    testing::internal::AssertHelper::operator=(local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

std::string FormatHeader(const NLHeader &h, bool var_bounds = true) {
  fmt::MemoryWriter w;
  w << h;
  if (var_bounds) {
    w << "b\n";
    for (int i = 0; i < h.num_vars; ++i)
      w << "1 0\n";
  }
  return w.str();
}